

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

GraphicsPipelineStateCreateInfoX * __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
::SetName(PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
          *this,char *Name)

{
  Char *pCVar1;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  undefined1 local_20;
  char *local_18;
  char *Name_local;
  PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  *this_local;
  
  if (Name != (char *)0x0) {
    local_18 = Name;
    Name_local = (char *)this;
    pVar2 = std::
            unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::emplace<char_const*&>
                      ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->StringPool,&local_18);
    local_28._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_20 = pVar2.second;
    std::__detail::
    _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)&local_28);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.PSODesc.
    super_DeviceObjectAttribs.Name = pCVar1;
  }
  return (GraphicsPipelineStateCreateInfoX *)this;
}

Assistant:

DerivedType& SetName(const char* Name)
    {
        if (Name != nullptr)
            this->PSODesc.Name = StringPool.emplace(Name).first->c_str();
        return static_cast<DerivedType&>(*this);
    }